

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkDeviceUtil.cpp
# Opt level: O0

VkPhysicalDevice
vk::chooseDevice(InstanceInterface *vkInstance,VkInstance instance,CommandLine *cmdLine)

{
  value_type pVVar1;
  bool bVar2;
  int iVar3;
  NotSupportedError *this;
  size_type sVar4;
  InternalError *this_00;
  const_reference ppVVar5;
  undefined1 local_38 [8];
  vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> devices;
  CommandLine *cmdLine_local;
  VkInstance instance_local;
  InstanceInterface *vkInstance_local;
  
  devices.super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)cmdLine;
  enumeratePhysicalDevices
            ((vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> *)local_38
             ,vkInstance,instance);
  bVar2 = std::vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>::empty
                    ((vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> *)
                     local_38);
  if (bVar2) {
    this = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this,"No Vulkan devices available",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkDeviceUtil.cpp"
               ,0x59);
    __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
  }
  iVar3 = tcu::CommandLine::getVKDeviceId
                    ((CommandLine *)
                     devices.
                     super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  sVar4 = std::vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>::size
                    ((vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> *)
                     local_38);
  bVar2 = de::inBounds<int>(iVar3,1,(int)sVar4 + 1);
  if (!bVar2) {
    this_00 = (InternalError *)__cxa_allocate_exception(0x38);
    tcu::InternalError::InternalError
              (this_00,"Invalid --deqp-vk-device-id",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkDeviceUtil.cpp"
               ,0x5c);
    __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
  }
  iVar3 = tcu::CommandLine::getVKDeviceId
                    ((CommandLine *)
                     devices.
                     super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ppVVar5 = std::vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>::
            operator[]((vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                        *)local_38,(long)(iVar3 + -1));
  pVVar1 = *ppVVar5;
  std::vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>::~vector
            ((vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> *)local_38
            );
  return pVVar1;
}

Assistant:

VkPhysicalDevice chooseDevice (const InstanceInterface& vkInstance, VkInstance instance, const tcu::CommandLine& cmdLine)
{
	const vector<VkPhysicalDevice>	devices	= enumeratePhysicalDevices(vkInstance, instance);

	if (devices.empty())
		TCU_THROW(NotSupportedError, "No Vulkan devices available");

	if (!de::inBounds(cmdLine.getVKDeviceId(), 1, (int)devices.size()+1))
		TCU_THROW(InternalError, "Invalid --deqp-vk-device-id");

	return devices[(size_t)(cmdLine.getVKDeviceId()-1)];
}